

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O2

ly_bool lyd_node_should_print(lyd_node *node,uint32_t options)

{
  ushort uVar1;
  undefined2 uVar2;
  uint uVar3;
  lysc_node *plVar4;
  ly_bool lVar5;
  lyd_node_inner *plVar6;
  lyd_node *node_00;
  lyd_node_inner *plVar7;
  
  uVar3 = node->flags;
  if ((options & 0x10) == 0) {
    if (((uVar3 & 1) == 0) || (node->schema->nodetype != 1)) {
      if ((options & 0xe0) != 0 || (uVar3 & 1) == 0) {
        return '\x01';
      }
      uVar1 = node->schema->flags;
      if ((uVar1 & 2) != 0) {
        return '\x01';
      }
      plVar6 = (lyd_node_inner *)node;
      if ((uVar1 & 0x7001) == 1) {
        while (plVar7 = plVar6, plVar7 != (lyd_node_inner *)0x0) {
          plVar4 = (plVar7->field_0).node.schema;
          uVar2 = plVar4->nodetype;
          uVar1 = plVar4->flags;
          if ((uVar1 & 2) != 0 && ((uVar1 & 0x80) != 0 || uVar2 != 1)) {
            return '\x01';
          }
          plVar6 = (lyd_node_inner *)lyd_child((lyd_node *)plVar7);
          if (plVar6 == (lyd_node_inner *)0x0) {
            if (plVar7 != (lyd_node_inner *)node) goto LAB_001386af;
            return '\0';
          }
          while ((plVar6 == (lyd_node_inner *)0x0 &&
                 (plVar7 = (plVar7->field_0).node.parent,
                 (plVar7->field_0).node.parent != node->parent))) {
LAB_001386af:
            plVar6 = (lyd_node_inner *)(plVar7->field_0).node.next;
          }
        }
      }
    }
    else {
      plVar6 = (lyd_node_inner *)node;
      if ((options & 4) != 0) {
        return '\x01';
      }
      while (plVar7 = plVar6, plVar7 != (lyd_node_inner *)0x0) {
        if ((plVar7 != (lyd_node_inner *)node) &&
           (lVar5 = lyd_node_should_print((lyd_node *)plVar7,options), lVar5 != '\0')) {
          return '\x01';
        }
        if ((undefined1  [56])((undefined1  [56])plVar7->field_0 & (undefined1  [56])0x100000000) ==
            (undefined1  [56])0x0) {
          __assert_fail("elem->flags & LYD_DEFAULT",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c"
                        ,0x54,"ly_bool lyd_node_should_print(const struct lyd_node *, uint32_t)");
        }
        plVar6 = (lyd_node_inner *)lyd_child((lyd_node *)plVar7);
        if (plVar6 == (lyd_node_inner *)0x0) {
          if (plVar7 != (lyd_node_inner *)node) goto LAB_001385df;
          return '\0';
        }
        while ((plVar6 == (lyd_node_inner *)0x0 &&
               (plVar7 = (plVar7->field_0).node.parent,
               (plVar7->field_0).node.parent != node->parent))) {
LAB_001385df:
          plVar6 = (lyd_node_inner *)(plVar7->field_0).node.next;
        }
      }
    }
  }
  else if ((uVar3 & 1) == 0) {
    plVar4 = node->schema;
    if (plVar4 == (lysc_node *)0x0) {
      return '\x01';
    }
    if ((plVar4->nodetype & 0xc) == 0) {
      if (plVar4->nodetype != 1) {
        return '\x01';
      }
      if ((plVar4->flags & 0x80) != 0) {
        return '\x01';
      }
      if ((options & 4) != 0) {
        return '\x01';
      }
      for (node_00 = lyd_child(node); node_00 != (lyd_node *)0x0; node_00 = node_00->next) {
        lVar5 = lyd_node_should_print(node_00,options);
        if (lVar5 != '\0') {
          return '\x01';
        }
      }
    }
    else {
      lVar5 = lyd_is_default(node);
      if (lVar5 == '\0') {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_node_should_print(const struct lyd_node *node, uint32_t options)
{
    const struct lyd_node *elem;

    if (options & LYD_PRINT_WD_TRIM) {
        /* do not print default nodes */
        if (node->flags & LYD_DEFAULT) {
            /* implicit default node/NP container with only default nodes */
            return 0;
        } else if (node->schema && (node->schema->nodetype & LYD_NODE_TERM)) {
            if (lyd_is_default(node)) {
                /* explicit default node */
                return 0;
            }
        } else if (lysc_is_np_cont(node->schema)) {
            if (options & LYD_PRINT_KEEPEMPTYCONT) {
                /* explicit request to print, redundant to check */
                return 1;
            }

            LY_LIST_FOR(lyd_child(node), elem) {
                if (lyd_node_should_print(elem, options)) {
                    return 1;
                }
            }

            /* NP container without any printed children (such as other NP containers with only nodes set to their default values) */
            return 0;
        }
    } else if ((node->flags & LYD_DEFAULT) && (node->schema->nodetype == LYS_CONTAINER)) {
        if (options & LYD_PRINT_KEEPEMPTYCONT) {
            /* explicit request to print */
            return 1;
        }

        /* avoid empty default containers */
        LYD_TREE_DFS_BEGIN(node, elem) {
            if ((elem != node) && lyd_node_should_print(elem, options)) {
                return 1;
            }
            assert(elem->flags & LYD_DEFAULT);
            LYD_TREE_DFS_END(node, elem)
        }
        return 0;
    } else if ((node->flags & LYD_DEFAULT) && !(options & LYD_PRINT_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYD_PRINT_WD_EXPLICIT, find out if this is some input/output */
        if (!(node->schema->flags & (LYS_IS_INPUT | LYS_IS_OUTPUT | LYS_IS_NOTIF)) && (node->schema->flags & LYS_CONFIG_W)) {
            /* print only if it contains status data in its subtree */
            LYD_TREE_DFS_BEGIN(node, elem) {
                if ((elem->schema->nodetype != LYS_CONTAINER) || (elem->schema->flags & LYS_PRESENCE)) {
                    if (elem->schema->flags & LYS_CONFIG_R) {
                        return 1;
                    }
                }
                LYD_TREE_DFS_END(node, elem)
            }
        }
        return 0;
    }

    return 1;
}